

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  Tables *pTVar1;
  char *pcVar2;
  _Node **pp_Var3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  FileDescriptor *pFVar8;
  Symbol *pSVar9;
  char cVar10;
  _Node *p_Var11;
  _Node *p_Var12;
  char *pcVar13;
  MutexLockMaybe lock;
  MutexLockMaybe local_48;
  Symbol local_40;
  
  local_48.mu_ = this->mutex_;
  if (local_48.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_48.mu_);
  }
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 == (Tables *)0x0) {
LAB_001cc3af:
    __assert_fail("ptr_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                  ,0x1e2,
                  "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                 );
  }
  pcVar2 = (symbol_name->_M_dataplus)._M_p;
  cVar10 = *pcVar2;
  if (cVar10 == '\0') {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    pcVar13 = pcVar2;
    do {
      pcVar13 = pcVar13 + 1;
      uVar7 = (long)cVar10 + uVar7 * 5;
      cVar10 = *pcVar13;
    } while (cVar10 != '\0');
  }
  pp_Var3 = (pTVar1->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_buckets;
  uVar4 = (pTVar1->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count;
  p_Var12 = pp_Var3[uVar7 % uVar4];
  p_Var11 = (_Node *)0x0;
  if (p_Var12 != (_Node *)0x0) {
    do {
      iVar6 = strcmp(pcVar2,(p_Var12->_M_v).first);
      p_Var11 = p_Var12;
      if (iVar6 == 0) break;
      p_Var12 = p_Var12->_M_next;
      p_Var11 = (_Node *)0x0;
    } while (p_Var12 !=
             (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
              *)0x0);
  }
  if (p_Var11 == (_Node *)0x0) {
    p_Var11 = pp_Var3[uVar4];
  }
  pSVar9 = &(p_Var11->_M_v).second;
  if (p_Var11 == pp_Var3[uVar4]) {
    pSVar9 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
  }
  local_40.field_1 = pSVar9->field_1;
  local_40.type = pSVar9->type;
  if (local_40.type == NULL_SYMBOL) {
    if ((this->underlay_ != (DescriptorPool *)0x0) &&
       (pFVar8 = FindFileContainingSymbol(this->underlay_,symbol_name),
       pFVar8 != (FileDescriptor *)0x0)) goto LAB_001cc2ac;
    bVar5 = TryFindSymbolInFallbackDatabase(this,symbol_name);
    if (!bVar5) {
      pFVar8 = (FileDescriptor *)0x0;
      goto LAB_001cc2ac;
    }
    pTVar1 = (this->tables_).ptr_;
    if (pTVar1 == (Tables *)0x0) goto LAB_001cc3af;
    pcVar2 = (symbol_name->_M_dataplus)._M_p;
    cVar10 = *pcVar2;
    if (cVar10 == '\0') {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      pcVar13 = pcVar2;
      do {
        pcVar13 = pcVar13 + 1;
        uVar7 = (long)cVar10 + uVar7 * 5;
        cVar10 = *pcVar13;
      } while (cVar10 != '\0');
    }
    pp_Var3 = (pTVar1->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets;
    uVar4 = (pTVar1->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_bucket_count;
    p_Var12 = pp_Var3[uVar7 % uVar4];
    p_Var11 = (_Node *)0x0;
    if (p_Var12 != (_Node *)0x0) {
      do {
        iVar6 = strcmp(pcVar2,(p_Var12->_M_v).first);
        p_Var11 = p_Var12;
        if (iVar6 == 0) break;
        p_Var12 = p_Var12->_M_next;
        p_Var11 = (_Node *)0x0;
      } while (p_Var12 !=
               (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                *)0x0);
    }
    if (p_Var11 == (_Node *)0x0) {
      p_Var11 = pp_Var3[uVar4];
    }
    pSVar9 = &(p_Var11->_M_v).second;
    pFVar8 = (FileDescriptor *)0x0;
    if (p_Var11 == pp_Var3[uVar4]) {
      pSVar9 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
    }
    local_40.field_1 = pSVar9->field_1;
    local_40.type = pSVar9->type;
    if (local_40.type == NULL_SYMBOL) goto LAB_001cc2ac;
  }
  pFVar8 = anon_unknown_1::Symbol::GetFile(&local_40);
LAB_001cc2ac:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_48);
  return pFVar8;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != NULL) {
    const FileDescriptor* file_result =
      underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != NULL) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return NULL;
}